

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmMakefileTargetGeneratorObjectStrings::MaybeConvertToRelativePath
          (string *__return_storage_ptr__,cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  cmStateDirectory *this_00;
  
  this_00 = &this->StateDir;
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(this_00);
  bVar2 = cmStateDirectory::ContainsBoth(this_00,psVar3,obj);
  if (bVar2) {
    psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(this_00);
    cmSystemTools::ForceToRelativePath(__return_storage_ptr__,psVar3,obj);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (obj->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + obj->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MaybeConvertToRelativePath(std::string const& obj)
  {
    if (!this->StateDir.ContainsBoth(this->StateDir.GetCurrentBinary(), obj)) {
      return obj;
    }
    return cmSystemTools::ForceToRelativePath(
      this->StateDir.GetCurrentBinary(), obj);
  }